

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaParseWildcardNs
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlSchemaWildcardPtr wildc,
              xmlNodePtr node)

{
  long lVar1;
  int iVar2;
  xmlChar *str1;
  xmlNodePtr node_00;
  byte *str1_00;
  xmlHashTablePtr pxVar3;
  ulong uVar4;
  xmlAttrPtr attr;
  xmlSchemaTypePtr value;
  int *piVar5;
  xmlSchemaWildcardNsPtr pxVar6;
  undefined4 uVar7;
  char *in_R8;
  int *piVar8;
  long lVar9;
  xmlChar *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar10;
  xmlSchemaWildcardNsPtr local_48;
  
  str1 = xmlSchemaGetProp(ctxt,(xmlNodePtr)wildc,"processContents");
  iVar10 = 0;
  uVar7 = 3;
  if ((str1 != (xmlChar *)0x0) && (iVar2 = xmlStrEqual(str1,(xmlChar *)"strict"), iVar2 == 0)) {
    iVar2 = xmlStrEqual(str1,(xmlChar *)"skip");
    if (iVar2 == 0) {
      iVar2 = xmlStrEqual(str1,(xmlChar *)"lax");
      if (iVar2 == 0) {
        in_R8 = "(strict | skip | lax)";
        iVar10 = 0xbdd;
        xmlSchemaPSimpleTypeErr
                  (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)wildc,
                   (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(strict | skip | lax)",(char *)str1,
                   (xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffffa8,
                   (xmlChar *)CONCAT44(0xbdd,in_stack_ffffffffffffffb0));
      }
      else {
        uVar7 = 2;
      }
    }
    else {
      uVar7 = 1;
    }
  }
  *(undefined4 *)&schema->annot = uVar7;
  node_00 = (xmlNodePtr)xmlSchemaGetPropNode((xmlNodePtr)wildc,"namespace");
  str1_00 = xmlSchemaGetNodeContent(ctxt,node_00);
  if ((node_00 == (xmlNodePtr)0x0) || (iVar2 = xmlStrEqual(str1_00,(xmlChar *)"##any"), iVar2 != 0))
  {
    *(undefined4 *)((long)&schema->annot + 4) = 1;
  }
  else {
    iVar2 = xmlStrEqual(str1_00,(xmlChar *)"##other");
    if (iVar2 == 0) {
      piVar8 = &schema->flags;
      local_48 = (xmlSchemaWildcardNsPtr)0x0;
      do {
        while ((uVar4 = (ulong)*str1_00, uVar4 < 0x21 && ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0)
               )) {
          str1_00 = str1_00 + 1;
        }
        lVar9 = 0;
        while ((0x20 < (byte)uVar4 || ((0x100002601U >> (uVar4 & 0x3f) & 1) == 0))) {
          lVar1 = lVar9 + 1;
          lVar9 = lVar9 + 1;
          uVar4 = (ulong)str1_00[lVar1];
        }
        if (lVar9 == 0) {
          return iVar10;
        }
        attr = (xmlAttrPtr)xmlStrndup(str1_00,(int)lVar9);
        iVar2 = xmlStrEqual((xmlChar *)attr,(xmlChar *)"##other");
        pxVar6 = local_48;
        if ((iVar2 == 0) && (iVar2 = xmlStrEqual((xmlChar *)attr,(xmlChar *)"##any"), iVar2 == 0)) {
          iVar2 = xmlStrEqual((xmlChar *)attr,(xmlChar *)"##targetNamespace");
          piVar5 = piVar8;
          if (iVar2 == 0) {
            iVar2 = xmlStrEqual((xmlChar *)attr,(xmlChar *)"##local");
            if (iVar2 == 0) {
              value = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
              xmlSchemaPValAttrNodeValue
                        (ctxt,(xmlSchemaBasicItemPtr)node_00,attr,(xmlChar *)value,
                         (xmlSchemaTypePtr)in_R8);
              pxVar3 = (xmlHashTablePtr)xmlDictLookup(ctxt->dict,(xmlChar *)attr,-1);
            }
            else {
              pxVar3 = (xmlHashTablePtr)0x0;
            }
          }
          else {
            pxVar3 = (xmlHashTablePtr)ctxt->targetNamespace;
          }
          do {
            piVar5 = *(int **)piVar5;
            if (piVar5 == (int *)0x0) {
              pxVar6 = xmlSchemaNewWildcardNsConstraint(ctxt);
              if (pxVar6 == (xmlSchemaWildcardNsPtr)0x0) {
                (*xmlFree)(attr);
                goto LAB_001b3a59;
              }
              pxVar6->value = (xmlChar *)pxVar3;
              pxVar6->next = (_xmlSchemaWildcardNs *)0x0;
              if (*(long *)piVar8 == 0) {
                *(xmlSchemaWildcardNsPtr *)piVar8 = pxVar6;
              }
              else if (local_48 != (xmlSchemaWildcardNsPtr)0x0) {
                local_48->next = pxVar6;
              }
              break;
            }
          } while (pxVar3 != *(xmlHashTablePtr *)(piVar5 + 2));
        }
        else {
          iVar10 = 0x700;
          in_R8 = "((##any | ##other) | List of (xs:anyURI | (##targetNamespace | ##local)))";
          xmlSchemaPSimpleTypeErr
                    (ctxt,XML_SCHEMAP_WILDCARD_INVALID_NS_MEMBER,(xmlSchemaBasicItemPtr)node_00,
                     (xmlNodePtr)0x0,
                     (xmlSchemaTypePtr)
                     "((##any | ##other) | List of (xs:anyURI | (##targetNamespace | ##local)))",
                     (char *)attr,(xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffffa8,
                     (xmlChar *)CONCAT44(0x700,in_stack_ffffffffffffffb0));
        }
        local_48 = pxVar6;
        str1_00 = str1_00 + lVar9;
        (*xmlFree)(attr);
      } while (*str1_00 != 0);
    }
    else {
      pxVar3 = (xmlHashTablePtr)xmlSchemaNewWildcardNsConstraint(ctxt);
      schema->typeDecl = pxVar3;
      if (pxVar3 == (xmlHashTablePtr)0x0) {
LAB_001b3a59:
        iVar10 = -1;
      }
      else {
        *(xmlChar **)&pxVar3->size = ctxt->targetNamespace;
      }
    }
  }
  return iVar10;
}

Assistant:

static int
xmlSchemaParseWildcardNs(xmlSchemaParserCtxtPtr ctxt,
			 xmlSchemaPtr schema ATTRIBUTE_UNUSED,
			 xmlSchemaWildcardPtr wildc,
			 xmlNodePtr node)
{
    const xmlChar *pc, *ns, *dictnsItem;
    int ret = 0;
    xmlChar *nsItem;
    xmlSchemaWildcardNsPtr tmp, lastNs = NULL;
    xmlAttrPtr attr;

    pc = xmlSchemaGetProp(ctxt, node, "processContents");
    if ((pc == NULL)
        || (xmlStrEqual(pc, (const xmlChar *) "strict"))) {
        wildc->processContents = XML_SCHEMAS_ANY_STRICT;
    } else if (xmlStrEqual(pc, (const xmlChar *) "skip")) {
        wildc->processContents = XML_SCHEMAS_ANY_SKIP;
    } else if (xmlStrEqual(pc, (const xmlChar *) "lax")) {
        wildc->processContents = XML_SCHEMAS_ANY_LAX;
    } else {
        xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    NULL, node,
	    NULL, "(strict | skip | lax)", pc,
	    NULL, NULL, NULL);
        wildc->processContents = XML_SCHEMAS_ANY_STRICT;
	ret = XML_SCHEMAP_S4S_ATTR_INVALID_VALUE;
    }
    /*
     * Build the namespace constraints.
     */
    attr = xmlSchemaGetPropNode(node, "namespace");
    ns = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
    if ((attr == NULL) || (xmlStrEqual(ns, BAD_CAST "##any")))
	wildc->any = 1;
    else if (xmlStrEqual(ns, BAD_CAST "##other")) {
	wildc->negNsSet = xmlSchemaNewWildcardNsConstraint(ctxt);
	if (wildc->negNsSet == NULL) {
	    return (-1);
	}
	wildc->negNsSet->value = ctxt->targetNamespace;
    } else {
	const xmlChar *end, *cur;

	cur = ns;
	do {
	    while (IS_BLANK_CH(*cur))
		cur++;
	    end = cur;
	    while ((*end != 0) && (!(IS_BLANK_CH(*end))))
		end++;
	    if (end == cur)
		break;
	    nsItem = xmlStrndup(cur, end - cur);
	    if ((xmlStrEqual(nsItem, BAD_CAST "##other")) ||
		    (xmlStrEqual(nsItem, BAD_CAST "##any"))) {
		xmlSchemaPSimpleTypeErr(ctxt,
		    XML_SCHEMAP_WILDCARD_INVALID_NS_MEMBER,
		    NULL, (xmlNodePtr) attr,
		    NULL,
		    "((##any | ##other) | List of (xs:anyURI | "
		    "(##targetNamespace | ##local)))",
		    nsItem, NULL, NULL, NULL);
		ret = XML_SCHEMAP_WILDCARD_INVALID_NS_MEMBER;
	    } else {
		if (xmlStrEqual(nsItem, BAD_CAST "##targetNamespace")) {
		    dictnsItem = ctxt->targetNamespace;
		} else if (xmlStrEqual(nsItem, BAD_CAST "##local")) {
		    dictnsItem = NULL;
		} else {
		    /*
		    * Validate the item (anyURI).
		    */
		    xmlSchemaPValAttrNodeValue(ctxt, NULL, attr,
			nsItem, xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI));
		    dictnsItem = xmlDictLookup(ctxt->dict, nsItem, -1);
		}
		/*
		* Avoid duplicate namespaces.
		*/
		tmp = wildc->nsSet;
		while (tmp != NULL) {
		    if (dictnsItem == tmp->value)
			break;
		    tmp = tmp->next;
		}
		if (tmp == NULL) {
		    tmp = xmlSchemaNewWildcardNsConstraint(ctxt);
		    if (tmp == NULL) {
			xmlFree(nsItem);
			return (-1);
		    }
		    tmp->value = dictnsItem;
		    tmp->next = NULL;
		    if (wildc->nsSet == NULL)
			wildc->nsSet = tmp;
		    else if (lastNs != NULL)
			lastNs->next = tmp;
		    lastNs = tmp;
		}

	    }
	    xmlFree(nsItem);
	    cur = end;
	} while (*cur != 0);
    }
    return (ret);
}